

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O1

bool __thiscall ManifestParser::ParseRule(ManifestParser *this,string *err)

{
  Lexer *this_00;
  _Rb_tree_header *p_Var1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  bool bVar6;
  Rule *pRVar7;
  long *plVar8;
  mapped_type *pmVar9;
  ulong *puVar10;
  byte unaff_BPL;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  Bindings *this_01;
  string key;
  string name;
  EvalString value;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Rule *local_90;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  EvalString local_48;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  this_00 = &(this->super_Parser).lexer_;
  bVar6 = Lexer::ReadIdent(this_00,&local_88);
  if (bVar6) {
    bVar6 = Parser::ExpectToken(&this->super_Parser,NEWLINE,err);
    if (!bVar6) {
      unaff_BPL = 0;
      goto LAB_0011bd83;
    }
    pRVar7 = BindingEnv::LookupRuleCurrentScope(this->env_,&local_88);
    if (pRVar7 == (Rule *)0x0) {
      pRVar7 = (Rule *)operator_new(0x50);
      (pRVar7->name_)._M_dataplus._M_p = (pointer)&(pRVar7->name_).field_2;
      local_90 = pRVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)pRVar7,local_88._M_dataplus._M_p,
                 local_88._M_dataplus._M_p + local_88._M_string_length);
      p_Var1 = &(pRVar7->bindings_)._M_t._M_impl.super__Rb_tree_header;
      (pRVar7->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (pRVar7->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pRVar7->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      (pRVar7->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
      ;
      (pRVar7->bindings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      do {
        bVar6 = Lexer::PeekToken(this_00,INDENT);
        if (!bVar6) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"rspfile","");
          this_01 = &local_90->bindings_;
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString>_>_>
                   ::operator[](this_01,&local_d0);
          ppVar2 = (pmVar9->parsed_).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar3 = (pmVar9->parsed_).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"rspfile_content","");
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString>_>_>
                   ::operator[](this_01,&local_b0);
          ppVar4 = (pmVar9->parsed_).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar5 = (pmVar9->parsed_).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          if ((ppVar2 == ppVar3) == (ppVar4 == ppVar5)) {
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"command","");
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString>_>_>
                     ::operator[](this_01,&local_d0);
            ppVar2 = (pmVar9->parsed_).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ppVar3 = (pmVar9->parsed_).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if (ppVar2 != ppVar3) {
              unaff_BPL = 1;
              BindingEnv::AddRule(this->env_,local_90);
              break;
            }
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,"expected \'command =\' line","");
            unaff_BPL = Lexer::Error(this_00,&local_d0,err);
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,"rspfile and rspfile_content need to be both specified",
                       "");
            unaff_BPL = Lexer::Error(this_00,&local_d0,err);
          }
          uVar11 = local_d0.field_2._M_allocated_capacity;
          _Var12._M_p = local_d0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) goto LAB_0011bd7b;
          break;
        }
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        local_d0._M_string_length = 0;
        local_d0.field_2._M_allocated_capacity =
             local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_48.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_48.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar6 = ParseLet(this,&local_d0,&local_48,err);
        if (bVar6) {
          bVar6 = Rule::IsReservedBinding(&local_d0);
          if (bVar6) {
            bVar6 = true;
            Rule::AddBinding(local_90,&local_d0,&local_48);
          }
          else {
            std::operator+(&local_68,"unexpected variable \'",&local_d0);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_68);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            puVar10 = (ulong *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar10) {
              local_b0.field_2._M_allocated_capacity = *puVar10;
              local_b0.field_2._8_8_ = plVar8[3];
            }
            else {
              local_b0.field_2._M_allocated_capacity = *puVar10;
              local_b0._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_b0._M_string_length = plVar8[1];
            *plVar8 = (long)puVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            unaff_BPL = Lexer::Error(this_00,&local_b0,err);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            bVar6 = false;
          }
        }
        else {
          bVar6 = false;
          unaff_BPL = 0;
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector(&local_48.parsed_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      } while (bVar6);
      goto LAB_0011bd83;
    }
    std::operator+(&local_b0,"duplicate rule \'",&local_88);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
    puVar10 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_d0.field_2._M_allocated_capacity = *puVar10;
      local_d0.field_2._8_8_ = plVar8[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *puVar10;
      local_d0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_d0._M_string_length = plVar8[1];
    *plVar8 = (long)puVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    unaff_BPL = Lexer::Error(this_00,&local_d0,err);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    uVar11 = local_b0.field_2._M_allocated_capacity;
    _Var12._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_0011bd83;
  }
  else {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"expected rule name","");
    unaff_BPL = Lexer::Error(this_00,&local_d0,err);
    uVar11 = local_d0.field_2._M_allocated_capacity;
    _Var12._M_p = local_d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_0011bd83;
  }
LAB_0011bd7b:
  operator_delete(_Var12._M_p,uVar11 + 1);
LAB_0011bd83:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool ManifestParser::ParseRule(string* err) {
  string name;
  if (!lexer_.ReadIdent(&name))
    return lexer_.Error("expected rule name", err);

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  if (env_->LookupRuleCurrentScope(name) != NULL)
    return lexer_.Error("duplicate rule '" + name + "'", err);

  Rule* rule = new Rule(name);  // XXX scoped_ptr

  while (lexer_.PeekToken(Lexer::INDENT)) {
    string key;
    EvalString value;
    if (!ParseLet(&key, &value, err))
      return false;

    if (Rule::IsReservedBinding(key)) {
      rule->AddBinding(key, value);
    } else {
      // Die on other keyvals for now; revisit if we want to add a
      // scope here.
      return lexer_.Error("unexpected variable '" + key + "'", err);
    }
  }

  if (rule->bindings_["rspfile"].empty() !=
      rule->bindings_["rspfile_content"].empty()) {
    return lexer_.Error("rspfile and rspfile_content need to be "
                        "both specified", err);
  }

  if (rule->bindings_["command"].empty())
    return lexer_.Error("expected 'command =' line", err);

  env_->AddRule(rule);
  return true;
}